

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O3

int Cba_FonSigned(Cba_Ntk_t *p,int f)

{
  uint uVar1;
  char *pcVar2;
  
  if (f < 0) {
    pcVar2 = Abc_NamStr(p->pDesign->pFuns,~f);
    pcVar2 = strchr(pcVar2,0x73);
    uVar1 = (uint)(pcVar2 != (char *)0x0);
  }
  else {
    if (f == 0) {
      __assert_fail("Cba_FonIsReal(f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                    ,0x112,"int Cba_FonRangeId(Cba_Ntk_t *, int)");
    }
    if ((p->vFonRange).nSize < 1) {
      uVar1 = 0;
    }
    else {
      Vec_IntFillExtra(&p->vFonRange,f + 1,0);
      if ((p->vFonRange).nSize <= f) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar1 = (p->vFonRange).pArray[(uint)f];
      if ((int)uVar1 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x130,"int Abc_LitIsCompl(int)");
      }
    }
    uVar1 = uVar1 & 1;
  }
  return uVar1;
}

Assistant:

static inline int            Cba_FonSigned( Cba_Ntk_t * p, int f )           { return Cba_FonIsConst(f) ? Cba_FonConstSigned(p, f) : Abc_LitIsCompl(Cba_FonRangeId(p, f)); }